

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.c
# Opt level: O2

int bitset_container_rank(bitset_container_t *container,uint16_t x)

{
  int iVar1;
  ulong uVar2;
  undefined6 in_register_00000032;
  ulong uVar3;
  ulong uVar4;
  
  uVar4 = CONCAT62(in_register_00000032,x) >> 6 & 0x3ffffff;
  iVar1 = 0;
  for (uVar3 = 0; uVar4 != uVar3; uVar3 = uVar3 + 1) {
    uVar2 = container->words[uVar3];
    uVar2 = uVar2 - (uVar2 >> 1 & 0x5555555555555555);
    uVar2 = (uVar2 >> 2 & 0x3333333333333333) + (uVar2 & 0x3333333333333333);
    iVar1 = iVar1 + (uint)(byte)(((uVar2 >> 4) + uVar2 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >>
                                0x38);
  }
  uVar4 = (2L << ((byte)x & 0x3f)) - 1U & container->words[uVar4];
  uVar4 = uVar4 - (uVar4 >> 1 & 0x5555555555555555);
  uVar4 = (uVar4 >> 2 & 0x3333333333333333) + (uVar4 & 0x3333333333333333);
  return iVar1 + (uint)(byte)(((uVar4 >> 4) + uVar4 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38
                             );
}

Assistant:

int bitset_container_rank(const bitset_container_t *container, uint16_t x) {
  // credit: aqrit
  int sum = 0;
  int i = 0;
  for (int end = x / 64; i < end; i++){
    sum += roaring_hamming(container->words[i]);
  }
  uint64_t lastword = container->words[i];
  uint64_t lastpos = UINT64_C(1) << (x % 64);
  uint64_t mask = lastpos + lastpos - 1; // smear right
  sum += roaring_hamming(lastword & mask);
  return sum;
}